

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall TupleLattice_GetBottom_Test::TestBody(TupleLattice_GetBottom_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  int local_40;
  bool local_39;
  tuple<bool,_int> local_38;
  Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> local_30 [8];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> tuple;
  TupleLattice_GetBottom_Test *this_local;
  
  ::wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::Tuple
            ((Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7),(Bool *)((long)&gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          + 6),
             (Integer<unsigned_int> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 5));
  ::wasm::analysis::Tuple<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>_>::getBottom
            (local_30);
  local_39 = false;
  local_40 = 0;
  std::tuple<bool,_int>::tuple<bool,_int,_true>(&local_38,&local_39,&local_40);
  testing::internal::EqHelper::
  Compare<std::tuple<bool,_unsigned_int>,_std::tuple<bool,_int>,_nullptr>
            ((EqHelper *)local_28,"tuple.getBottom()","(std::tuple{false, 0})",
             (tuple<bool,_unsigned_int> *)local_30,&local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1fc,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(TupleLattice, GetBottom) {
  analysis::Tuple<analysis::Bool, analysis::UInt32> tuple{analysis::Bool{},
                                                          analysis::UInt32{}};
  EXPECT_EQ(tuple.getBottom(), (std::tuple{false, 0}));
}